

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntGetEntry(Vec_Int_t *p,int i)

{
  int iVar1;
  
  Vec_IntFillExtra(p,i + 1,0);
  iVar1 = Vec_IntEntry(p,i);
  return iVar1;
}

Assistant:

static inline int Vec_IntGetEntry( Vec_Int_t * p, int i )
{
    Vec_IntFillExtra( p, i + 1, 0 );
    return Vec_IntEntry( p, i );
}